

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::torrent::on_proxy_name_lookup
          (torrent *this,error_code *e,
          vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *addrs,
          iterator web,int port)

{
  error_code *this_00;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  undefined8 uVar6;
  pointer pwVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  session_settings *this_01;
  const_reference addr;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  element_type *this_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  int __type;
  undefined4 in_register_00000084;
  error_code *ec_00;
  string_view url;
  anon_class_32_3_f5ba5eaf local_258;
  function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
  local_238;
  undefined1 local_211;
  undefined1 local_210 [8];
  shared_ptr<libtorrent::aux::torrent> self;
  undefined1 local_1f8 [52];
  undefined4 local_1c4;
  torrent *local_1c0;
  undefined1 local_1b8 [56];
  undefined1 local_180 [16];
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  undefined1 local_e8 [8];
  string protocol;
  error_code ec;
  string hostname;
  endpoint a;
  string local_60;
  int local_2c;
  per_timer_data *ppStack_28;
  int port_local;
  vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *addrs_local;
  error_code *e_local;
  torrent *this_local;
  iterator web_local;
  
  ec_00 = (error_code *)CONCAT44(in_register_00000084,port);
  local_2c = port;
  ppStack_28 = (per_timer_data *)addrs;
  addrs_local = (vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *)e;
  e_local = (error_code *)this;
  this_local = (torrent *)web._M_node;
  ::std::_List_iterator<libtorrent::aux::web_seed_t>::operator->
            ((_List_iterator<libtorrent::aux::web_seed_t> *)&this_local);
  uVar6 = ::std::__cxx11::string::c_str();
  (*(this->super_request_callback)._vptr_request_callback[7])
            (this,"completed resolve proxy hostname for: %s",uVar6);
  bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)addrs_local);
  if ((bVar1) &&
     (uVar3 = (*(this->super_request_callback)._vptr_request_callback[6])(), (uVar3 & 1) != 0)) {
    boost::system::error_code::message_abi_cxx11_(&local_60,(error_code *)addrs_local);
    uVar6 = ::std::__cxx11::string::c_str();
    (*(this->super_request_callback)._vptr_request_callback[7])
              (this,"proxy name lookup error: %s",uVar6);
    ::std::__cxx11::string::~string((string *)&local_60);
  }
  pwVar7 = ::std::_List_iterator<libtorrent::aux::web_seed_t>::operator->
                     ((_List_iterator<libtorrent::aux::web_seed_t> *)&this_local);
  pwVar7->resolving = false;
  pwVar7 = ::std::_List_iterator<libtorrent::aux::web_seed_t>::operator->
                     ((_List_iterator<libtorrent::aux::web_seed_t> *)&this_local);
  if ((pwVar7->removed & 1U) == 0) {
    if (((*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1a & 1) == 0) &&
       (uVar3 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[0x11])(), (uVar3 & 1) == 0)) {
      bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)addrs_local);
      if ((bVar1) ||
         (bVar1 = ::std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
                  ::empty((vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
                           *)ppStack_28), bVar1)) {
        iVar4 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[5])();
        bVar1 = alert_manager::should_post<libtorrent::url_seed_alert>
                          ((alert_manager *)CONCAT44(extraout_var,iVar4));
        if (bVar1) {
          iVar4 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                    _vptr_session_logger[5])();
          get_handle((torrent *)((long)&a.impl_.data_.v6.sin6_addr.__in6_u + 0xc));
          pwVar7 = ::std::_List_iterator<libtorrent::aux::web_seed_t>::operator->
                             ((_List_iterator<libtorrent::aux::web_seed_t> *)&this_local);
          alert_manager::
          emplace_alert<libtorrent::url_seed_alert,libtorrent::torrent_handle,std::__cxx11::string&,boost::system::error_code_const&>
                    ((alert_manager *)CONCAT44(extraout_var_00,iVar4),
                     (torrent_handle *)((long)&a.impl_.data_.v6.sin6_addr.__in6_u + 0xc),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pwVar7,
                     (error_code *)addrs_local);
          torrent_handle::~torrent_handle
                    ((torrent_handle *)((long)&a.impl_.data_.v6.sin6_addr.__in6_u + 0xc));
        }
        pwVar7 = ::std::_List_iterator<libtorrent::aux::web_seed_t>::operator->
                           ((_List_iterator<libtorrent::aux::web_seed_t> *)&this_local);
        pwVar7->disabled = true;
      }
      else {
        iVar4 = num_peers(this);
        if (iVar4 < (int)((uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48
                                >> 0x21) & 0xffffff)) {
          iVar4 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                    _vptr_session_logger[0x1e])();
          this_01 = settings(this);
          iVar5 = session_settings::get_int(this_01,0x4055);
          if (iVar4 < iVar5) {
            addr = ::std::
                   vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>::
                   operator[]((vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
                               *)ppStack_28,0);
            boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
                      ((basic_endpoint<boost::asio::ip::tcp> *)((long)&hostname.field_2 + 0xc),addr,
                       (unsigned_short)local_2c);
            ::std::__cxx11::string::string((string *)&ec.cat_);
            this_00 = (error_code *)((long)&protocol.field_2 + 8);
            boost::system::error_code::error_code(this_00);
            ::std::__cxx11::string::string((string *)local_e8);
            pwVar7 = ::std::_List_iterator<libtorrent::aux::web_seed_t>::operator->
                               ((_List_iterator<libtorrent::aux::web_seed_t> *)&this_local);
            local_180 = ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)pwVar7)
            ;
            url._M_len = local_180._8_8_;
            url._M_str = (char *)this_00;
            parse_url_components_abi_cxx11_(&local_170,local_180._0_8_,url,ec_00);
            ::std::
            tie<std::__cxx11::string,std::_Swallow_assign_const,std::__cxx11::string,int,std::_Swallow_assign_const>
                      ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::_Swallow_assign_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int_&,_const_std::_Swallow_assign_&>
                        *)(local_1b8 + 0x10),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8
                       ,(_Swallow_assign *)&::std::ignore,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ec.cat_
                       ,&local_2c,(_Swallow_assign *)&::std::ignore);
            ::std::
            tuple<std::__cxx11::string&,std::_Swallow_assign_const&,std::__cxx11::string&,int&,std::_Swallow_assign_const&>
            ::operator=((tuple<std::__cxx11::string&,std::_Swallow_assign_const&,std::__cxx11::string&,int&,std::_Swallow_assign_const&>
                         *)(local_1b8 + 0x10),&local_170);
            ::std::
            tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~tuple(&local_170);
            if (local_2c == -1) {
              bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_e8,"http");
              local_2c = 0x1bb;
              if (bVar1) {
                local_2c = 0x50;
              }
            }
            bVar1 = boost::system::error_code::operator_cast_to_bool
                              ((error_code *)((long)&protocol.field_2 + 8));
            if (bVar1) {
              iVar4 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                        _vptr_session_logger[5])();
              bVar1 = alert_manager::should_post<libtorrent::url_seed_alert>
                                ((alert_manager *)CONCAT44(extraout_var_01,iVar4));
              if (bVar1) {
                iVar4 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                          _vptr_session_logger[5])();
                get_handle((torrent *)local_1b8);
                pwVar7 = ::std::_List_iterator<libtorrent::aux::web_seed_t>::operator->
                                   ((_List_iterator<libtorrent::aux::web_seed_t> *)&this_local);
                alert_manager::
                emplace_alert<libtorrent::url_seed_alert,libtorrent::torrent_handle,std::__cxx11::string&,boost::system::error_code&>
                          ((alert_manager *)CONCAT44(extraout_var_02,iVar4),
                           (torrent_handle *)local_1b8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           pwVar7,(error_code *)((long)&protocol.field_2 + 8));
                torrent_handle::~torrent_handle((torrent_handle *)local_1b8);
              }
              local_1c0 = this_local;
              remove_web_seed_iter(this,(iterator)this_local);
              local_1c4 = 1;
            }
            else {
              bVar2 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_ip_filter)
              ;
              bVar1 = false;
              if (bVar2) {
                this_02 = ::std::
                          __shared_ptr_access<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)&this->m_ip_filter);
                boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
                          ((address *)(local_1f8 + 0x10),
                           (basic_endpoint<boost::asio::ip::tcp> *)((long)&hostname.field_2 + 0xc));
                uVar3 = ip_filter::access(this_02,(char *)(local_1f8 + 0x10),__type);
                bVar1 = (uVar3 & 1) != 0;
              }
              if (bVar1) {
                iVar4 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                          _vptr_session_logger[5])();
                bVar1 = alert_manager::should_post<libtorrent::peer_blocked_alert>
                                  ((alert_manager *)CONCAT44(extraout_var_03,iVar4));
                if (bVar1) {
                  iVar4 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                            _vptr_session_logger[5])();
                  get_handle((torrent *)local_1f8);
                  self.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi._4_4_ = 0;
                  alert_manager::
                  emplace_alert<libtorrent::peer_blocked_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::peer_blocked_alert::reason_t>
                            ((alert_manager *)CONCAT44(extraout_var_04,iVar4),
                             (torrent_handle *)local_1f8,
                             (basic_endpoint<boost::asio::ip::tcp> *)((long)&hostname.field_2 + 0xc)
                             ,(reason_t *)
                              ((long)&self.
                                      super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi + 4));
                  torrent_handle::~torrent_handle((torrent_handle *)local_1f8);
                }
                local_1c4 = 1;
              }
              else {
                ::std::enable_shared_from_this<libtorrent::aux::torrent>::shared_from_this
                          ((enable_shared_from_this<libtorrent::aux::torrent> *)local_210);
                pwVar7 = ::std::_List_iterator<libtorrent::aux::web_seed_t>::operator->
                                   ((_List_iterator<libtorrent::aux::web_seed_t> *)&this_local);
                pwVar7->resolving = true;
                iVar4 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                          _vptr_session_logger[8])();
                local_211 = 2;
                ::std::shared_ptr<libtorrent::aux::torrent>::shared_ptr
                          (&local_258.self,(shared_ptr<libtorrent::aux::torrent> *)local_210);
                local_258.web._M_node = (_List_node_base *)this_local;
                local_258.port = local_2c;
                ::std::
                function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>
                ::
                function<libtorrent::aux::torrent::on_proxy_name_lookup(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&,std::_List_iterator<libtorrent::aux::web_seed_t>,int)::__0,void>
                          ((function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>
                            *)&local_238,&local_258);
                (*(code *)**(undefined8 **)CONCAT44(extraout_var_05,iVar4))
                          ((undefined8 *)CONCAT44(extraout_var_05,iVar4),&ec.cat_,local_211,
                           &local_238);
                ::std::
                function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
                ::~function(&local_238);
                on_proxy_name_lookup(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&,std::_List_iterator<libtorrent::aux::web_seed_t>,int)
                ::$_0::~__0((__0 *)&local_258);
                ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
                          ((shared_ptr<libtorrent::aux::torrent> *)local_210);
                local_1c4 = 0;
              }
            }
            ::std::__cxx11::string::~string((string *)local_e8);
            ::std::__cxx11::string::~string((string *)&ec.cat_);
          }
        }
      }
    }
  }
  else {
    (*(this->super_request_callback)._vptr_request_callback[7])(this,"removed web seed");
    remove_web_seed_iter(this,(iterator)this_local);
  }
  return;
}

Assistant:

void torrent::on_proxy_name_lookup(error_code const& e
		, std::vector<address> const& addrs
		, std::list<web_seed_t>::iterator web, int port) try
	{
		TORRENT_ASSERT(is_single_thread());

		INVARIANT_CHECK;

		TORRENT_ASSERT(web->resolving);
#ifndef TORRENT_DISABLE_LOGGING
		debug_log("completed resolve proxy hostname for: %s", web->url.c_str());
		if (e && should_log())
			debug_log("proxy name lookup error: %s", e.message().c_str());
#endif
		web->resolving = false;

		if (web->removed)
		{
#ifndef TORRENT_DISABLE_LOGGING
			debug_log("removed web seed");
#endif
			remove_web_seed_iter(web);
			return;
		}

		if (m_abort) return;
		if (m_ses.is_aborted()) return;

		if (e || addrs.empty())
		{
			if (m_ses.alerts().should_post<url_seed_alert>())
			{
				m_ses.alerts().emplace_alert<url_seed_alert>(get_handle()
					, web->url, e);
			}

			// the name lookup failed for the http host. Don't try
			// this host again
			web->disabled = true;
			return;
		}

		if (num_peers() >= int(m_max_connections)
			|| m_ses.num_connections() >= settings().get_int(settings_pack::connections_limit))
			return;

		tcp::endpoint a(addrs[0], std::uint16_t(port));

		std::string hostname;
		error_code ec;
		std::string protocol;
		std::tie(protocol, std::ignore, hostname, port, std::ignore)
			= parse_url_components(web->url, ec);
		if (port == -1) port = protocol == "http" ? 80 : 443;

		if (ec)
		{
			if (m_ses.alerts().should_post<url_seed_alert>())
			{
				m_ses.alerts().emplace_alert<url_seed_alert>(get_handle()
					, web->url, ec);
			}
			remove_web_seed_iter(web);
			return;
		}

		if (m_ip_filter && m_ip_filter->access(a.address()) & ip_filter::blocked)
		{
			if (m_ses.alerts().should_post<peer_blocked_alert>())
				m_ses.alerts().emplace_alert<peer_blocked_alert>(get_handle()
					, a, peer_blocked_alert::ip_filter);
			return;
		}

		auto self = shared_from_this();
		web->resolving = true;
		m_ses.get_resolver().async_resolve(hostname, aux::resolver_interface::abort_on_shutdown
			, [self, web, port](error_code const& err, std::vector<address> const& addr)
			{
				self->wrap(&torrent::on_name_lookup, err, addr, port, web);
			});
	}
	catch (...) { handle_exception(); }